

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

Matrix<float,_4,_3> * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::outerProduct<float,3,4>
          (Matrix<float,_4,_3> *__return_storage_ptr__,MatrixCaseUtils *this,Vector<float,_4> *a,
          Vector<float,_3> *b)

{
  float fVar1;
  Vector<float,_4> *pVVar2;
  Matrix<float,_4,_3> *pMVar3;
  float *pfVar4;
  Vector<float,_3> *pVVar5;
  Vector<float,_3> *pVVar6;
  int r;
  long lVar7;
  int row;
  long lVar8;
  int c;
  long lVar9;
  undefined4 uVar10;
  Matrix<float,_3,_4> retVal;
  
  pMVar3 = __return_storage_ptr__;
  pfVar4 = (float *)&retVal;
  retVal.m_data.m_data[2].m_data[2] = 0.0;
  retVal.m_data.m_data[3].m_data[0] = 0.0;
  retVal.m_data.m_data[3].m_data[1] = 0.0;
  retVal.m_data.m_data[3].m_data[2] = 0.0;
  retVal.m_data.m_data[1].m_data[1] = 0.0;
  retVal.m_data.m_data[1].m_data[2] = 0.0;
  retVal.m_data.m_data[2].m_data[0] = 0.0;
  retVal.m_data.m_data[2].m_data[1] = 0.0;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  retVal.m_data.m_data[0].m_data[2] = 0.0;
  retVal.m_data.m_data[1].m_data[0] = 0.0;
  lVar7 = 0;
  lVar8 = 0;
  do {
    lVar9 = 0;
    do {
      uVar10 = 0x3f800000;
      if (lVar7 != lVar9) {
        uVar10 = 0;
      }
      *(undefined4 *)((long)pfVar4 + lVar9) = uVar10;
      lVar9 = lVar9 + 0xc;
    } while (lVar9 != 0x30);
    lVar8 = lVar8 + 1;
    pfVar4 = pfVar4 + 1;
    lVar7 = lVar7 + 0xc;
  } while (lVar8 != 3);
  pVVar5 = (Vector<float,_3> *)&retVal;
  lVar7 = 0;
  do {
    fVar1 = a->m_data[lVar7];
    lVar8 = 0;
    pVVar6 = pVVar5;
    do {
      ((Vector<tcu::Vector<float,_3>,_4> *)pVVar6->m_data)->m_data[0].m_data[0] =
           *(float *)(this + lVar8 * 4) * fVar1;
      lVar8 = lVar8 + 1;
      pVVar6 = pVVar6 + 1;
    } while (lVar8 != 4);
    lVar7 = lVar7 + 1;
    pVVar5 = (Vector<float,_3> *)(pVVar5->m_data + 1);
  } while (lVar7 != 3);
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  pVVar2 = (__return_storage_ptr__->m_data).m_data;
  pVVar2[2].m_data[2] = 0.0;
  pVVar2[2].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  pVVar2 = (__return_storage_ptr__->m_data).m_data;
  pVVar2[1].m_data[2] = 0.0;
  pVVar2[1].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[3] = 0.0;
  lVar7 = 0;
  lVar8 = 0;
  pfVar4 = (float *)__return_storage_ptr__;
  do {
    lVar9 = 0;
    do {
      uVar10 = 0x3f800000;
      if (lVar7 != lVar9) {
        uVar10 = 0;
      }
      *(undefined4 *)((long)pfVar4 + lVar9) = uVar10;
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0x30);
    lVar8 = lVar8 + 1;
    pfVar4 = pfVar4 + 1;
    lVar7 = lVar7 + 0x10;
  } while (lVar8 != 4);
  pVVar5 = (Vector<float,_3> *)&retVal;
  lVar7 = 0;
  do {
    lVar8 = 0;
    pVVar6 = pVVar5;
    do {
      ((Vector<tcu::Vector<float,_4>,_3> *)((Vector<float,_4> *)__return_storage_ptr__)->m_data)->
      m_data[0].m_data[lVar8] =
           ((Vector<tcu::Vector<float,_3>,_4> *)pVVar6->m_data)->m_data[0].m_data[0];
      lVar8 = lVar8 + 1;
      pVVar6 = pVVar6 + 1;
    } while (lVar8 != 4);
    lVar7 = lVar7 + 1;
    __return_storage_ptr__ = (Matrix<float,_4,_3> *)((long)__return_storage_ptr__ + 0x10);
    pVVar5 = (Vector<float,_3> *)(pVVar5->m_data + 1);
  } while (lVar7 != 3);
  return pMVar3;
}

Assistant:

tcu::Matrix<T, Cols, Rows> outerProduct (const tcu::Vector<T, Cols>& a, const tcu::Vector<T, Rows>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a[c] * b[r];

	return transpose(retVal); // to gl-form (column-major)
}